

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O1

int mapLandB18(Layer *l,int *out,int x,int z,int w,int h)

{
  int iVar1;
  int iVar2;
  uint64_t uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int *piVar13;
  int iVar14;
  long lVar15;
  int *piVar16;
  int iVar17;
  int *piVar18;
  int iVar19;
  int *piVar20;
  long local_90;
  
  iVar17 = w + 2;
  iVar6 = (*l->p->getMap)(l->p,out,x + -1,z + -1,iVar17,h + 2);
  if (iVar6 == 0) {
    if (0 < h) {
      uVar3 = l->startSeed;
      lVar15 = (long)w;
      piVar18 = out + lVar15 * 2 + 6;
      piVar13 = out + lVar15 + 3;
      local_90 = 0;
      piVar16 = out;
      piVar20 = out;
      do {
        if (0 < w) {
          lVar8 = local_90 * iVar17;
          lVar11 = (local_90 + 2) * (long)iVar17;
          lVar9 = (long)(z + (int)local_90);
          lVar12 = 0;
          iVar6 = out[lVar11];
          iVar10 = out[lVar11 + 1];
          iVar14 = out[lVar8];
          iVar19 = out[lVar8 + 1];
          do {
            iVar7 = piVar13[lVar12];
            iVar1 = piVar20[lVar12 + 2];
            iVar2 = piVar18[lVar12];
            if (iVar7 == 1) {
              if ((((iVar14 != 1) || (iVar6 != 1)) || (iVar1 != 1)) || (iVar7 = 1, iVar2 != 1)) {
                lVar8 = (long)(x + (int)lVar12);
                lVar11 = uVar3 + lVar8;
                lVar11 = (lVar11 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar11 + lVar9;
                lVar8 = (lVar11 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar11 + lVar8;
                lVar8 = (lVar8 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar8 + lVar9;
                auVar4._8_8_ = lVar8 >> 0x3f;
                auVar4._0_8_ = lVar8 >> 0x18;
                iVar7 = (int)((SUB164(auVar4 % SEXT816(5),4) >> 0x1f & 5U) +
                             SUB164(auVar4 % SEXT816(5),0)) / -4 + 1;
              }
            }
            else if ((iVar7 == 0) &&
                    (((iVar14 != 0 || (iVar6 != 0)) || ((iVar1 != 0 || (iVar2 != 0)))))) {
              lVar8 = (long)(x + (int)lVar12);
              lVar11 = uVar3 + lVar8;
              lVar11 = (lVar11 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar11 + lVar9;
              lVar8 = (lVar11 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar11 + lVar8;
              lVar8 = (lVar8 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar8 + lVar9;
              auVar5._8_8_ = lVar8 >> 0x3f;
              auVar5._0_8_ = lVar8 >> 0x18;
              iVar7 = (int)((SUB164(auVar5 % SEXT816(3),4) >> 0x1f & 3U) +
                           SUB164(auVar5 % SEXT816(3),0)) / 2;
            }
            piVar16[lVar12] = iVar7;
            lVar12 = lVar12 + 1;
            iVar6 = iVar10;
            iVar10 = iVar2;
            iVar14 = iVar19;
            iVar19 = iVar1;
          } while (lVar15 != lVar12);
        }
        local_90 = local_90 + 1;
        piVar16 = piVar16 + lVar15;
        piVar18 = piVar18 + lVar15 + 2;
        piVar20 = piVar20 + lVar15 + 2;
        piVar13 = piVar13 + lVar15 + 2;
      } while (local_90 != h);
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int mapLandB18(const Layer * l, int * out, int x, int z, int w, int h)
{
    int pX = x - 1;
    int pZ = z - 1;
    int64_t pW = w + 2;
    int64_t pH = h + 2;
    int64_t i, j;

    int err = l->p->getMap(l->p, out, pX, pZ, (int)pW, (int)pH);
    if unlikely(err != 0)
        return err;

    uint64_t ss = l->startSeed;
    uint64_t cs;

    for (j = 0; j < h; j++)
    {
        int *vz0 = out + (j+0)*pW;
        int *vz1 = out + (j+1)*pW;
        int *vz2 = out + (j+2)*pW;

        int v00 = vz0[0], vt0 = vz0[1];
        int v02 = vz2[0], vt2 = vz2[1];
        int v20, v22;
        int v11, v;

        for (i = 0; i < w; i++)
        {
            v11 = vz1[i+1];
            v20 = vz0[i+2];
            v22 = vz2[i+2];
            v = v11;

            if (v11 == 0 && (v00 != 0 || v02 != 0 || v20 != 0 || v22 != 0))
            {
                cs = getChunkSeed(ss, i+x, j+z);
                v = mcFirstInt(cs, 3) / 2;
            }
            else if (v11 == 1 && (v00 != 1 || v02 != 1 || v20 != 1 || v22 != 1))
            {
                cs = getChunkSeed(ss, i+x, j+z);
                v = 1 - mcFirstInt(cs, 5) / 4;
            }

            out[i + j*w] = v;
            v00 = vt0; vt0 = v20;
            v02 = vt2; vt2 = v22;
        }
    }

    return 0;
}